

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DefaultConfigRuleSyntax *pDVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::ConfigLiblistSyntax_*>::operator*
            ((not_null<slang::syntax::ConfigLiblistSyntax_*> *)0x590183);
  deepClone<slang::syntax::ConfigLiblistSyntax>
            ((ConfigLiblistSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultConfigRuleSyntax,slang::parsing::Token,slang::syntax::ConfigLiblistSyntax&,slang::parsing::Token>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultConfigRuleSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultConfigRuleSyntax>(
        node.defaultKeyword.deepClone(alloc),
        *deepClone<ConfigLiblistSyntax>(*node.liblist, alloc),
        node.semi.deepClone(alloc)
    );
}